

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

void __thiscall
OpenMD::SelectionSet::flip(SelectionSet *this,vector<int,_std::allocator<int>_> *bitIndex)

{
  int i;
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    OpenMDBitSet::flip((OpenMDBitSet *)
                       ((long)&(((this->bitsets_).
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_> + lVar2),
                       (long)(bitIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar1]);
    lVar2 = lVar2 + 0x28;
  }
  return;
}

Assistant:

void SelectionSet::flip(std::vector<int> bitIndex) {
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      bitsets_[i].flip(bitIndex[i]);
  }